

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::TestTextureFramebuffer
          (GetAttachmentParametersTest *this,bool depth_stencil)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_698;
  GetNameFunc local_518;
  int local_510;
  Enum<int,_2UL> local_508;
  MessageBuilder local_4f8;
  int local_378;
  GLenum local_374;
  GLenum error_1;
  GLint optional_parameter_dsa;
  GLint optional_parameter_legacy;
  GLuint i;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  int local_34;
  GLenum local_30;
  GLenum error;
  GLint parameter_dsa;
  GLint parameter_legacy;
  GLuint j;
  bool is_ok;
  Functions *gl;
  GetAttachmentParametersTest *pGStack_10;
  bool depth_stencil_local;
  GetAttachmentParametersTest *this_local;
  
  gl._7_1_ = depth_stencil;
  pGStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _j = CONCAT44(extraout_var,iVar1);
  parameter_legacy._3_1_ = 1;
  for (parameter_dsa = 0; (uint)parameter_dsa < 5; parameter_dsa = parameter_dsa + 1) {
    if ((TestTextureFramebuffer::attachments[(uint)parameter_dsa] != 0x821a) ||
       ((gl._7_1_ & 1) != 0)) {
      error = 0;
      local_30 = 0;
      (**(code **)(_j + 0x830))
                (0x8d40,TestTextureFramebuffer::attachments[(uint)parameter_dsa],0x8cd0,&error);
      dVar2 = (**(code **)(_j + 0x800))();
      glu::checkError(dVar2,"glGetFramebufferParameteriv has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x119e);
      (**(code **)(_j + 0x910))
                (this->m_fbo,TestTextureFramebuffer::attachments[(uint)parameter_dsa],0x8cd0,
                 &local_30);
      local_34 = (**(code **)(_j + 0x800))();
      if (local_34 == 0) {
        if (error == local_30) {
          if (local_30 != 0) {
            for (optional_parameter_dsa = 0; (uint)optional_parameter_dsa < 0xd;
                optional_parameter_dsa = optional_parameter_dsa + 1) {
              if ((TestTextureFramebuffer::attachments[(uint)parameter_dsa] != 0x821a) ||
                 (TestTextureFramebuffer::optional_pnames[(uint)optional_parameter_dsa] != 0x8211))
              {
                error_1 = 0;
                local_374 = 0;
                (**(code **)(_j + 0x830))
                          (0x8d40,TestTextureFramebuffer::attachments[(uint)parameter_dsa],
                           TestTextureFramebuffer::optional_pnames[(uint)optional_parameter_dsa],
                           &error_1);
                dVar2 = (**(code **)(_j + 0x800))();
                glu::checkError(dVar2,"glGetFramebufferParameteriv has failed",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                                ,0x11ee);
                (**(code **)(_j + 0x910))
                          (this->m_fbo,TestTextureFramebuffer::attachments[(uint)parameter_dsa],
                           TestTextureFramebuffer::optional_pnames[(uint)optional_parameter_dsa],
                           &local_374);
                local_378 = (**(code **)(_j + 0x800))();
                if (local_378 == 0) {
                  if (error_1 != local_374) {
                    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                    pTVar5 = tcu::TestContext::getLog(pTVar4);
                    tcu::TestLog::operator<<
                              (&local_698,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
                    pMVar6 = tcu::MessageBuilder::operator<<
                                       (&local_698,
                                        (char (*) [51])
                                        "GetNamedFramebufferAttachmentParameteriv returned ");
                    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_374);
                    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2a6afaf);
                    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&error_1);
                    pMVar6 = tcu::MessageBuilder::operator<<
                                       (pMVar6,(char (*) [19])" was expected for ");
                    pMVar6 = tcu::MessageBuilder::operator<<
                                       (pMVar6,(char *(*) [13])
                                               TestTextureFramebuffer::optional_pnames_strings);
                    pMVar6 = tcu::MessageBuilder::operator<<
                                       (pMVar6,(char (*) [22])" parameter name  for ");
                    pMVar6 = tcu::MessageBuilder::operator<<
                                       (pMVar6,TestTextureFramebuffer::attachments_strings +
                                               (uint)parameter_dsa);
                    pMVar6 = tcu::MessageBuilder::operator<<
                                       (pMVar6,(char (*) [43])
                                               " attachment of texture framebuffer object.");
                    tcu::MessageBuilder::operator<<
                              (pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    tcu::MessageBuilder::~MessageBuilder(&local_698);
                    parameter_legacy._3_1_ = 0;
                  }
                }
                else {
                  pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                  pTVar5 = tcu::TestContext::getLog(pTVar4);
                  tcu::TestLog::operator<<
                            (&local_4f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar6 = tcu::MessageBuilder::operator<<
                                     (&local_4f8,
                                      (char (*) [65])
                                      "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
                                     );
                  EVar7 = glu::getErrorStr(local_378);
                  local_518 = EVar7.m_getName;
                  local_510 = EVar7.m_value;
                  local_508.m_getName = local_518;
                  local_508.m_value = local_510;
                  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_508);
                  pMVar6 = tcu::MessageBuilder::operator<<
                                     (pMVar6,(char (*) [25])" error when called with ");
                  pMVar6 = tcu::MessageBuilder::operator<<
                                     (pMVar6,TestTextureFramebuffer::optional_pnames_strings +
                                             (uint)optional_parameter_dsa);
                  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [21])0x2a6b4ff);
                  pMVar6 = tcu::MessageBuilder::operator<<
                                     (pMVar6,TestTextureFramebuffer::attachments_strings +
                                             (uint)parameter_dsa);
                  pMVar6 = tcu::MessageBuilder::operator<<
                                     (pMVar6,(char (*) [90])
                                             " attachment of texture framebuffer object. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
                                     );
                  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&error);
                  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b5e49a);
                  tcu::MessageBuilder::operator<<
                            (pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_4f8);
                  parameter_legacy._3_1_ = 0;
                }
              }
            }
          }
        }
        else {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&optional_parameter_legacy,pTVar5,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&optional_parameter_legacy,
                              (char (*) [51])"GetNamedFramebufferAttachmentParameteriv returned ");
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_30);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2a6afaf);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&error);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,(char (*) [102])
                                     " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of texture framebuffer object."
                             );
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&optional_parameter_legacy);
          parameter_legacy._3_1_ = 0;
        }
      }
      else {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<(&local_1b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1b8,
                            (char (*) [65])
                            "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ");
        EVar7 = glu::getErrorStr(local_34);
        local_1e8 = EVar7.m_getName;
        local_1e0 = EVar7.m_value;
        local_1d8[0].m_getName = local_1e8;
        local_1d8[0].m_value = local_1e0;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1d8);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [82])
                                   " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
                           );
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,TestTextureFramebuffer::attachments_strings + (uint)parameter_dsa
                           );
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [43])" attachment of texture framebuffer object.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1b8);
        parameter_legacy._3_1_ = 0;
      }
    }
  }
  return (bool)(parameter_legacy._3_1_ & 1);
}

Assistant:

bool GetAttachmentParametersTest::TestTextureFramebuffer(bool depth_stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum attachments[] = { GL_DEPTH_ATTACHMENT, GL_STENCIL_ATTACHMENT, GL_DEPTH_STENCIL_ATTACHMENT,
											   GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };

	static const glw::GLchar* attachments_strings[] = { "GL_DEPTH_ATTACHMENT", "GL_STENCIL_ATTACHMENT",
														"GL_DEPTH_STENCIL_ATTACHMENT", "GL_COLOR_ATTACHMENT0",
														"GL_COLOR_ATTACHMENT1" };

	static const glw::GLuint attachments_count = sizeof(attachments) / sizeof(attachments[0]);

	for (glw::GLuint j = 0; j < attachments_count; ++j)
	{
		/* Omit DEPTH_STENCIL_ATTACHMENT attachment if the renderbuffer is not depth-stencil. */
		if (attachments[j] == GL_DEPTH_STENCIL_ATTACHMENT)
		{
			if (!depth_stencil)
			{
				continue;
			}
		}

		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferAttachmentParameteriv(m_fbo, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
													&parameter_dsa);

		/* Error check. */
		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
				<< glu::getErrorStr(error)
				<< " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
				<< attachments_strings[j] << " attachment of texture framebuffer object." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned " << parameter_dsa
				<< ", but " << parameter_legacy << " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter "
												   "name of texture framebuffer object."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_dsa != GL_NONE)
		{
			static const glw::GLenum optional_pnames[] = { GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME,
														   GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL,
														   GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE,
														   GL_FRAMEBUFFER_ATTACHMENT_LAYERED,
														   GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER,
														   GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
														   GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE,
														   GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING };

			static const glw::GLchar* optional_pnames_strings[] = { "GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME",
																	"GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL",
																	"GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE",
																	"GL_FRAMEBUFFER_ATTACHMENT_LAYERED",
																	"GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER",
																	"GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE",
																	"GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE",
																	"GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING" };

			static const glw::GLuint optional_pnames_count = sizeof(optional_pnames) / sizeof(optional_pnames[0]);

			for (glw::GLuint i = 0; i < optional_pnames_count; ++i)
			{
				/* Omit FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE pname when DEPTH_STENCIL_ATTACHMENT attachment is used. */
				if (attachments[j] == GL_DEPTH_STENCIL_ATTACHMENT)
				{
					if (optional_pnames[i] == GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE)
					{
						continue;
					}
				}

				glw::GLint optional_parameter_legacy = 0;
				glw::GLint optional_parameter_dsa	= 0;

				gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], optional_pnames[i],
													   &optional_parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

				gl.getNamedFramebufferAttachmentParameteriv(m_fbo, attachments[j], optional_pnames[i],
															&optional_parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << optional_pnames_strings[i]
						<< " parameter name for " << attachments_strings[j]
						<< " attachment of texture framebuffer object. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
						<< parameter_legacy << "." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (optional_parameter_legacy != optional_parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned "
						<< optional_parameter_dsa << ", but " << optional_parameter_legacy << " was expected for "
						<< optional_pnames_strings << " parameter name  for " << attachments_strings[j]
						<< " attachment of texture framebuffer object." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}
			}
		}
	}

	return is_ok;
}